

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_helper.cpp
# Opt level: O0

void Unit_Test::generateRoi
               (vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                *image,vector<unsigned_int,_std::allocator<unsigned_int>_> *x,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *y,uint32_t *width,
               uint32_t *height)

{
  ulong uVar1;
  allocator_type *__a;
  size_type sVar2;
  const_reference pvVar3;
  reference this;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  *in_RDI;
  size_t i;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  imageSize;
  undefined1 *__n;
  uint in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff94;
  pair<unsigned_int,_unsigned_int> local_68;
  ulong local_60;
  uint32_t *in_stack_ffffffffffffffb0;
  uint32_t *in_stack_ffffffffffffffb8;
  pointer in_stack_ffffffffffffffc0;
  pointer in_stack_ffffffffffffffc8;
  pointer in_stack_ffffffffffffffd0;
  
  __a = (allocator_type *)
        std::
        vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
        ::size(in_RDI);
  __n = &stack0xffffffffffffffbf;
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::allocator
            ((allocator<std::pair<unsigned_int,_unsigned_int>_> *)0x18b1ea);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),(size_type)__n,__a);
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::~allocator
            ((allocator<std::pair<unsigned_int,_unsigned_int>_> *)0x18b20a);
  local_60 = 0;
  while( true ) {
    uVar1 = local_60;
    sVar2 = std::
            vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
            ::size(in_RDI);
    if (sVar2 <= uVar1) break;
    pvVar3 = std::
             vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             ::operator[](in_RDI,local_60);
    PenguinV_Image::ImageTemplate<unsigned_char>::width(pvVar3);
    pvVar3 = std::
             vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             ::operator[](in_RDI,local_60);
    PenguinV_Image::ImageTemplate<unsigned_char>::height(pvVar3);
    std::pair<unsigned_int,_unsigned_int>::pair<unsigned_int,_unsigned_int,_true>
              (&local_68,(uint *)&stack0xffffffffffffff94,(uint *)&stack0xffffffffffffff90);
    this = std::
           vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ::operator[]((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                         *)&stack0xffffffffffffffc0,local_60);
    std::pair<unsigned_int,_unsigned_int>::operator=(this,&local_68);
    local_60 = local_60 + 1;
  }
  generateRoi((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               *)in_stack_ffffffffffffffd0,
              (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffffc8,
              (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffffc0,
              in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             *)__a);
  return;
}

Assistant:

void generateRoi( const std::vector < PenguinV_Image::Image > & image, std::vector < uint32_t > & x, std::vector < uint32_t > & y,
                      uint32_t & width, uint32_t & height )
    {
        std::vector < std::pair < uint32_t, uint32_t> > imageSize( image.size() );

        for( size_t i = 0; i < image.size(); ++i )
            imageSize[i] = std::pair < uint32_t, uint32_t >( image[i].width(), image[i].height() ) ;

        generateRoi( imageSize, x, y, width, height );
    }